

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O0

void fl_draw(char *str,int x,int y,int w,int h,Fl_Align align,
            _func_void_char_ptr_int_int_int *callthis,Fl_Image *img,int draw_symbols)

{
  char cVar1;
  Fl_Align FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Color FVar8;
  char *src;
  bool bVar9;
  double dVar10;
  int local_2bc;
  int local_2ac;
  Fl_Align local_2a8;
  Fl_Align local_2a4;
  int local_298;
  int desc;
  int yimg;
  int imgw [2];
  int imgh;
  int imgvert;
  int height;
  int ypos;
  int xpos;
  int strh;
  int strw;
  double width;
  int lines;
  int imgtotal;
  int symtotal;
  int symoffset;
  int symwidth [2];
  char *symptr;
  char symbol [2] [255];
  char *pcStack_40;
  int buflen;
  char *e;
  char *p;
  char *linebuf;
  Fl_Align local_20;
  Fl_Align align_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  char *str_local;
  
  p = (char *)0x0;
  if ((img != (Fl_Image *)0x0) && ((align & 0x200) != 0)) {
    img = (Fl_Image *)0x0;
  }
  symptr._0_1_ = 0;
  symtotal = 0;
  symbol[0][0xf7] = '\0';
  symoffset = 0;
  linebuf._4_4_ = align;
  local_20 = h;
  align_local = w;
  h_local = y;
  w_local = x;
  _y_local = str;
  if (draw_symbols != 0) {
    if ((((str != (char *)0x0) && (*str == '@')) && (str[1] != '\0')) && (str[1] != '@')) {
      symwidth = (int  [2])&symptr;
      while( true ) {
        bVar9 = false;
        if (*_y_local != '\0') {
          iVar3 = isspace((int)*_y_local);
          bVar9 = false;
          if (iVar3 == 0) {
            bVar9 = (ulong)symwidth < (long)symbol[0] + 0xf6U;
          }
        }
        if (!bVar9) break;
        cVar1 = *_y_local;
        _y_local = _y_local + 1;
        *(char *)symwidth = cVar1;
        symwidth = (int  [2])((long)symwidth + 1);
      }
      *(undefined1 *)symwidth = 0;
      iVar3 = isspace((int)*_y_local);
      if (iVar3 != 0) {
        _y_local = _y_local + 1;
      }
      if ((int)align_local < (int)local_20) {
        local_2a4 = align_local;
      }
      else {
        local_2a4 = local_20;
      }
      symtotal = local_2a4;
    }
    if (((_y_local != (char *)0x0) && (src = strrchr(_y_local,0x40), src != (char *)0x0)) &&
       ((_y_local + 1 < src && (src[-1] != '@')))) {
      fl_strlcpy(symbol[0] + 0xf7,src,0xff);
      if ((int)align_local < (int)local_20) {
        local_2a8 = align_local;
      }
      else {
        local_2a8 = local_20;
      }
      symoffset = local_2a8;
    }
  }
  lines = symtotal + symoffset;
  if ((img == (Fl_Image *)0x0) || ((linebuf._4_4_ & 0x100) == 0)) {
    local_2ac = 0;
  }
  else {
    local_2ac = Fl_Image::w(img);
  }
  width._4_4_ = local_2ac;
  xpos = 0;
  if (_y_local == (char *)0x0) {
    width._0_4_ = 0;
  }
  else {
    e = _y_local;
    width._0_4_ = 0;
    while (e != (char *)0x0) {
      e = expand_text_(e,&p,0,(double)(int)((align_local - lines) - width._4_4_),
                       (int *)(symbol[1] + 0xfd),(double *)&strh,linebuf._4_4_ & 0x80,draw_symbols);
      if ((double)xpos < _strh) {
        xpos = (int)_strh;
      }
      width._0_4_ = width._0_4_ + 1;
      if ((*e == '\0') || (((*e == '@' && (e[1] != '@')) && (draw_symbols != 0)))) break;
    }
  }
  iVar3 = width._0_4_;
  if (((symtotal != 0) || (symoffset != 0)) && (width._0_4_ != 0)) {
    if (symtotal != 0) {
      iVar4 = fl_height();
      symtotal = iVar3 * iVar4;
    }
    iVar3 = width._0_4_;
    if (symoffset != 0) {
      iVar4 = fl_height();
      symoffset = iVar3 * iVar4;
    }
  }
  iVar3 = width._0_4_;
  lines = symtotal + symoffset;
  iVar4 = fl_height();
  iVar5 = fl_height();
  imgw[1] = (int)((linebuf._4_4_ & 0x100) == 0);
  if ((img == (Fl_Image *)0x0) || (imgw[1] == 0)) {
    local_2bc = 0;
  }
  else {
    local_2bc = Fl_Image::h(img);
  }
  imgw[0] = local_2bc;
  memset(&desc,0,8);
  imgtotal = 0;
  if ((linebuf._4_4_ & 2) == 0) {
    iVar6 = h_local;
    if ((linebuf._4_4_ & 1) == 0) {
      iVar6 = h_local + (int)((local_20 - width._0_4_ * iVar5) - imgw[0]) / 2;
    }
    imgvert = iVar6 + iVar5;
  }
  else {
    imgvert = ((h_local + local_20) - (width._0_4_ + -1) * iVar5) - imgw[0];
  }
  if (((img != (Fl_Image *)0x0) && (imgw[1] != 0)) && ((linebuf._4_4_ & 0x20) == 0)) {
    iVar6 = Fl_Image::w(img);
    if (imgtotal < iVar6) {
      imgtotal = Fl_Image::w(img);
    }
    iVar6 = w_local;
    FVar2 = align_local;
    if ((linebuf._4_4_ & 4) == 0) {
      if ((linebuf._4_4_ & 8) == 0) {
        iVar7 = Fl_Image::w(img);
        height = iVar6 + (int)((FVar2 - iVar7) - lines) / 2 + symtotal;
      }
      else {
        iVar6 = w_local + align_local;
        iVar7 = Fl_Image::w(img);
        height = (iVar6 - iVar7) - symoffset;
      }
    }
    else {
      height = w_local + symtotal;
    }
    Fl_Image::draw(img,height,imgvert - iVar5);
    iVar6 = Fl_Image::h(img);
    imgvert = iVar6 + imgvert;
  }
  if ((img != (Fl_Image *)0x0) && (imgw[1] == 0)) {
    if ((linebuf._4_4_ & 0x20) == 0) {
      desc = Fl_Image::w(img);
      if ((linebuf._4_4_ & 4) == 0) {
        if ((linebuf._4_4_ & 8) == 0) {
          iVar6 = w_local + (int)(((align_local - xpos) - lines) - desc) / 2;
        }
        else {
          iVar6 = (((w_local + align_local) - symoffset) - xpos) - desc;
        }
      }
      else {
        iVar6 = w_local + symtotal;
      }
      height = iVar6 + -1;
    }
    else {
      yimg = Fl_Image::w(img);
      if ((linebuf._4_4_ & 4) == 0) {
        if ((linebuf._4_4_ & 8) == 0) {
          iVar6 = w_local + (int)(((align_local - xpos) - lines) - yimg) / 2 + symtotal + xpos;
        }
        else {
          iVar6 = ((w_local + align_local) - symoffset) - yimg;
        }
      }
      else {
        iVar6 = w_local + symtotal + xpos;
      }
      height = iVar6 + 1;
    }
    local_298 = imgvert - iVar5;
    if ((linebuf._4_4_ & 1) == 0) {
      if ((linebuf._4_4_ & 2) == 0) {
        iVar6 = Fl_Image::h(img);
        iVar3 = ((iVar3 * iVar4 - iVar6) + -1) / 2;
      }
      else {
        iVar6 = Fl_Image::h(img);
        iVar3 = (iVar3 * iVar4 - iVar6) + -1;
      }
      local_298 = iVar3 + local_298;
    }
    Fl_Image::draw(img,height,local_298);
  }
  if (_y_local != (char *)0x0) {
    iVar3 = fl_descent();
    e = _y_local;
    while( true ) {
      if (width._0_4_ < 2) {
        pcStack_40 = "";
      }
      else {
        pcStack_40 = expand_text_(e,&p,0,(double)(int)((align_local - lines) - width._4_4_),
                                  (int *)(symbol[1] + 0xfd),(double *)&strh,linebuf._4_4_ & 0x80,
                                  draw_symbols);
      }
      if ((double)imgtotal < _strh) {
        imgtotal = (int)(_strh + 0.5);
      }
      if ((linebuf._4_4_ & 4) == 0) {
        if ((linebuf._4_4_ & 8) == 0) {
          height = w_local + (int)((((align_local - (int)(_strh + 0.5)) - lines) - desc) - yimg) / 2
                   + symtotal + desc;
        }
        else {
          height = (((w_local + align_local) - (int)(_strh + 0.5)) - symoffset) - yimg;
        }
      }
      else {
        height = w_local + symtotal + desc;
      }
      (*callthis)(p,stack0xffffffffffffffbc,height,imgvert - iVar3);
      if (((underline_at != (char *)0x0) && (p <= underline_at)) &&
         (underline_at < p + stack0xffffffffffffffbc)) {
        dVar10 = fl_width(p,(int)underline_at - (int)p);
        (*callthis)("_",1,height + (int)dVar10,imgvert - iVar3);
      }
      if ((*pcStack_40 == '\0') || ((*pcStack_40 == '@' && (pcStack_40[1] != '@')))) break;
      e = pcStack_40;
      imgvert = iVar5 + imgvert;
    }
  }
  if (((img != (Fl_Image *)0x0) && (imgw[1] != 0)) && ((linebuf._4_4_ & 0x20) != 0)) {
    iVar3 = Fl_Image::w(img);
    if (imgtotal < iVar3) {
      imgtotal = Fl_Image::w(img);
    }
    iVar3 = w_local;
    FVar2 = align_local;
    if ((linebuf._4_4_ & 4) == 0) {
      if ((linebuf._4_4_ & 8) == 0) {
        iVar4 = Fl_Image::w(img);
        height = iVar3 + (int)((FVar2 - iVar4) - lines) / 2 + symtotal;
      }
      else {
        iVar3 = w_local + align_local;
        iVar4 = Fl_Image::w(img);
        height = (iVar3 - iVar4) - symoffset;
      }
    }
    else {
      height = w_local + symtotal;
    }
    Fl_Image::draw(img,height,imgvert);
  }
  iVar3 = symtotal;
  if (symtotal != 0) {
    if ((linebuf._4_4_ & 4) == 0) {
      if ((linebuf._4_4_ & 8) == 0) {
        height = w_local + (int)((align_local - imgtotal) - lines) / 2;
      }
      else {
        height = ((w_local + align_local) - lines) - imgtotal;
      }
    }
    else {
      height = w_local;
    }
    if ((linebuf._4_4_ & 2) == 0) {
      if ((linebuf._4_4_ & 1) == 0) {
        imgvert = h_local + (int)(local_20 - symtotal) / 2;
      }
      else {
        imgvert = h_local;
      }
    }
    else {
      imgvert = (h_local + local_20) - symtotal;
    }
    FVar8 = fl_color();
    fl_draw_symbol((char *)&symptr,height,imgvert,iVar3,iVar3,FVar8);
  }
  iVar3 = symoffset;
  if (symoffset != 0) {
    if ((linebuf._4_4_ & 4) == 0) {
      if ((linebuf._4_4_ & 8) == 0) {
        height = w_local + (int)((align_local - imgtotal) - lines) / 2 + imgtotal + symtotal;
      }
      else {
        height = (w_local + align_local) - symoffset;
      }
    }
    else {
      height = w_local + imgtotal + symtotal;
    }
    if ((linebuf._4_4_ & 2) == 0) {
      if ((linebuf._4_4_ & 1) == 0) {
        imgvert = h_local + (int)(local_20 - symoffset) / 2;
      }
      else {
        imgvert = h_local;
      }
    }
    else {
      imgvert = (h_local + local_20) - symoffset;
    }
    FVar8 = fl_color();
    fl_draw_symbol(symbol[0] + 0xf7,height,imgvert,iVar3,iVar3,FVar8);
  }
  return;
}

Assistant:

void fl_draw(
    const char* str,	// the (multi-line) string
    int x, int y, int w, int h,	// bounding box
    Fl_Align align,
    void (*callthis)(const char*,int,int,int),
    Fl_Image* img, int draw_symbols)
{
  char *linebuf = NULL;
  const char* p;
  const char* e;
  int buflen;
  char symbol[2][255], *symptr;
  int symwidth[2], symoffset, symtotal, imgtotal;

  // count how many lines and put the last one into the buffer:
  int lines;
  double width;

  // if the image is set as a backdrop, ignore it here
  if (img && (align & FL_ALIGN_IMAGE_BACKDROP)) img = 0;

  symbol[0][0] = '\0';
  symwidth[0]  = 0;

  symbol[1][0] = '\0';
  symwidth[1]  = 0;

  if (draw_symbols) {
    if (str && str[0] == '@' && str[1] && str[1] != '@') {
      // Start with a symbol...
      for (symptr = symbol[0];
           *str && !isspace(*str) && symptr < (symbol[0] + sizeof(symbol[0]) - 1);
           *symptr++ = *str++) {/*empty*/}
      *symptr = '\0';
      if (isspace(*str)) str++;
      symwidth[0] = (w < h ? w : h);
    }

    if (str && (p = strrchr(str, '@')) != NULL && p > (str + 1) && p[-1] != '@') {
      strlcpy(symbol[1], p, sizeof(symbol[1]));
      symwidth[1] = (w < h ? w : h);
    }
  }

  symtotal = symwidth[0] + symwidth[1];
  imgtotal = (img && (align&FL_ALIGN_IMAGE_NEXT_TO_TEXT)) ? img->w() : 0;

  int strw = 0;
  int strh;

  if (str) {
    for (p = str, lines=0; p;) {
      e = expand_text_(p, linebuf, 0, w - symtotal - imgtotal, buflen, width,
                         align&FL_ALIGN_WRAP, draw_symbols);
      if (strw<width) strw = (int)width;
      lines++;
      if (!*e || (*e == '@' && e[1] != '@' && draw_symbols)) break;
      p = e;
    }
  } else lines = 0;

  if ((symwidth[0] || symwidth[1]) && lines) {
    if (symwidth[0]) symwidth[0] = lines * fl_height();
    if (symwidth[1]) symwidth[1] = lines * fl_height();
  }

  symtotal = symwidth[0] + symwidth[1];
  strh = lines * fl_height();

  // figure out vertical position of the first line:
  int xpos;
  int ypos;
  int height = fl_height();
  int imgvert = ((align&FL_ALIGN_IMAGE_NEXT_TO_TEXT)==0);
  int imgh = img && imgvert ? img->h() : 0;
  int imgw[2] = {0, 0};

  symoffset = 0;

  if (align & FL_ALIGN_BOTTOM) ypos = y+h-(lines-1)*height-imgh;
  else if (align & FL_ALIGN_TOP) ypos = y+height;
  else ypos = y+(h-lines*height-imgh)/2+height;

  // draw the image unless the "text over image" alignment flag is set...
  if (img && imgvert && !(align & FL_ALIGN_TEXT_OVER_IMAGE)) {
    if (img->w() > symoffset) symoffset = img->w();

    if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - img->w() - symwidth[1];
    else xpos = x + (w - img->w() - symtotal) / 2 + symwidth[0];

    img->draw(xpos, ypos - height);
    ypos += img->h();
  }

  // draw the image to the side of the text
  if (img && !imgvert /* && (align & !FL_ALIGN_TEXT_NEXT_TO_IMAGE)*/ ) {
    if (align & FL_ALIGN_TEXT_OVER_IMAGE) { // image is right of text
      imgw[1] = img->w();
      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] + strw + 1;
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1] - imgw[1] + 1;
      else xpos = x + (w - strw - symtotal - imgw[1]) / 2 + symwidth[0] + strw + 1;
    } else { // image is to the left of the text
      imgw[0] = img->w();
      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] - 1;
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1] - strw - imgw[0] - 1;
      else xpos = x + (w - strw - symtotal - imgw[0]) / 2 - 1;
    }
    int yimg = ypos - height;
    if (align & FL_ALIGN_TOP) ;
    else if (align & FL_ALIGN_BOTTOM) yimg += strh - img->h() - 1;
    else yimg += (strh - img->h() - 1) / 2;
    img->draw(xpos, yimg);
  }

  // now draw all the lines:
  if (str) {
    int desc = fl_descent();
    for (p=str; ; ypos += height) {
      if (lines>1) e = expand_text_(p, linebuf, 0, w - symtotal - imgtotal, buflen,
				width, align&FL_ALIGN_WRAP, draw_symbols);
      else e = "";

      if (width > symoffset) symoffset = (int)(width + 0.5);

      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] + imgw[0];
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - (int)(width + .5) - symwidth[1] - imgw[1];
      else xpos = x + (w - (int)(width + .5) - symtotal - imgw[0] - imgw[1]) / 2 + symwidth[0] + imgw[0];

      callthis(linebuf,buflen,xpos,ypos-desc);

      if (underline_at && underline_at >= linebuf && underline_at < (linebuf + buflen))
	callthis("_",1,xpos+int(fl_width(linebuf,(int) (underline_at-linebuf))),ypos-desc);

      if (!*e || (*e == '@' && e[1] != '@')) break;
      p = e;
    }
  }

  // draw the image if the "text over image" alignment flag is set...
  if (img && imgvert && (align & FL_ALIGN_TEXT_OVER_IMAGE)) {
    if (img->w() > symoffset) symoffset = img->w();

    if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - img->w() - symwidth[1];
    else xpos = x + (w - img->w() - symtotal) / 2 + symwidth[0];

    img->draw(xpos, ypos);
  }

  // draw the symbols, if any...
  if (symwidth[0]) {
    // draw to the left
    if (align & FL_ALIGN_LEFT) xpos = x;
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - symtotal - symoffset;
    else xpos = x + (w - symoffset - symtotal) / 2;

    if (align & FL_ALIGN_BOTTOM) ypos = y + h - symwidth[0];
    else if (align & FL_ALIGN_TOP) ypos = y;
    else ypos = y + (h - symwidth[0]) / 2;

    fl_draw_symbol(symbol[0], xpos, ypos, symwidth[0], symwidth[0], fl_color());
  }

  if (symwidth[1]) {
    // draw to the right
    if (align & FL_ALIGN_LEFT) xpos = x + symoffset + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1];
    else xpos = x + (w - symoffset - symtotal) / 2 + symoffset + symwidth[0];

    if (align & FL_ALIGN_BOTTOM) ypos = y + h - symwidth[1];
    else if (align & FL_ALIGN_TOP) ypos = y;
    else ypos = y + (h - symwidth[1]) / 2;

    fl_draw_symbol(symbol[1], xpos, ypos, symwidth[1], symwidth[1], fl_color());
  }
}